

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall
restincurl::
OutDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~OutDataHandler(OutDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_DataHandlerBase)._vptr_DataHandlerBase = (_func_int **)&PTR__OutDataHandler_0013b938;
  pcVar2 = (this->data_)._M_dataplus._M_p;
  paVar1 = &(this->data_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

OutDataHandler(const T& v) : data_{v} {}